

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::beckmann::sigma_std_radial(beckmann *this,float_t zi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if ((zi == 1.0) && (!NAN(zi))) {
    return 1.0;
  }
  fVar1 = 1.0;
  if (zi * zi <= 1.0) {
    fVar1 = zi * zi;
  }
  fVar1 = 1.0 - fVar1;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar3 = zi / fVar1;
  fVar2 = expf(-fVar3 * fVar3);
  fVar3 = erff(fVar3);
  return ((fVar3 + 1.0) * zi + fVar2 * 0.56418955 * fVar1) * 0.5;
}

Assistant:

float_t beckmann::sigma_std_radial(float_t zi) const
{
	if (zi == 1) return 1;
	float_t z_i = sqrt(1 - sat(sqr(zi)));
	float_t nu = zi / z_i;
	float_t tmp = exp(-sqr(nu)) * inversesqrt(m_pi());
	return (zi * (1 + erf(nu)) + z_i * tmp) / 2;
}